

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::api::json::DecodePsbtResponse::~DecodePsbtResponse(DecodePsbtResponse *this)

{
  DecodeRawTransactionResponse *in_RDI;
  
  (in_RDI->super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtResponse_0057f5f0;
  core::JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct>::
  ~JsonObjectVector((JsonObjectVector<cfd::api::json::DecodePsbtOutput,_DecodePsbtOutputStruct> *)
                    0x46389d);
  core::JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct>::~JsonObjectVector
            ((JsonObjectVector<cfd::api::json::DecodePsbtInput,_DecodePsbtInputStruct> *)0x4638ae);
  core::JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct>::~JsonObjectVector
            ((JsonObjectVector<cfd::api::json::PsbtMapData,_PsbtMapDataStruct> *)0x4638bf);
  core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::~JsonObjectVector
            ((JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *)0x4638d0);
  std::__cxx11::string::~string((string *)&in_RDI[1].txid_);
  DecodeRawTransactionResponse::~DecodeRawTransactionResponse(in_RDI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x4638fd);
  core::JsonClassBase<cfd::api::json::DecodePsbtResponse>::~JsonClassBase
            ((JsonClassBase<cfd::api::json::DecodePsbtResponse> *)in_RDI);
  return;
}

Assistant:

virtual ~DecodePsbtResponse() {
    // do nothing
  }